

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

string * sznet::sz_gethostname_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  char local_118 [8];
  char buf [256];
  
  iVar1 = gethostname(local_118,0x100);
  if (iVar1 == 0) {
    buf[0xf7] = '\0';
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    strlen(local_118);
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  }
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

string sz_gethostname()
{
	char buf[256];
	if (::gethostname(buf, sizeof(buf)) == 0)
	{
		buf[sizeof(buf) - 1] = '\0';
		return buf;
	}
	else
	{
		return "unknownhost";
	}
}